

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void unixShmBarrier(sqlite3_file *fd)

{
  if (unixBigLock != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
  }
  if (unixBigLock != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
    return;
  }
  return;
}

Assistant:

static void unixShmBarrier(
  sqlite3_file *fd                /* Database file holding the shared memory */
){
  UNUSED_PARAMETER(fd);
  sqlite3MemoryBarrier();         /* compiler-defined memory barrier */
  assert( fd->pMethods->xLock==nolockLock
       || unixFileMutexNotheld((unixFile*)fd)
  );
  unixEnterMutex();               /* Also mutex, for redundancy */
  unixLeaveMutex();
}